

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_common.c
# Opt level: O2

int load_real_openal(void)

{
  char *pcVar1;
  FILE *pFVar2;
  undefined8 uVar3;
  char *pcVar4;
  size_t sVar5;
  char *__s;
  int okay;
  
  okay = 1;
  realdll = (void *)dlopen("libopenal.so.1",2);
  pFVar2 = _stderr;
  pcVar4 = GAppName;
  if (realdll == (void *)0x0) {
    uVar3 = dlerror();
    fprintf(pFVar2,"%s: Failed to load %s: %s\n",pcVar4,"libopenal.so.1",uVar3);
    fflush(_stderr);
    if (realdll == (void *)0x0) {
      pcVar4 = getcwd((char *)0x0,0);
      if (pcVar4 != (char *)0x0) {
        sVar5 = strlen(pcVar4);
        __s = (char *)malloc(sVar5 + 0x10);
        if (__s != (char *)0x0) {
          snprintf(__s,sVar5 + 0x10,"%s/%s",pcVar4,"libopenal.so.1");
          realdll = (void *)dlopen("libopenal.so.1",2);
          pFVar2 = _stderr;
          pcVar1 = GAppName;
          if (realdll == (void *)0x0) {
            uVar3 = dlerror();
            fprintf(pFVar2,"%s: Failed to load %s: %s\n",pcVar1,__s,uVar3);
            fflush(_stderr);
          }
          free(__s);
        }
        free(pcVar4);
      }
      if (realdll == (void *)0x0) {
        fprintf(_stderr,"%s: Couldn\'t load OpenAL from anywhere obvious. Giving up.\n",GAppName);
        fflush(_stderr);
        return 0;
      }
    }
  }
  REAL_alcGetCurrentContext =
       (_func_ALCcontext_ptr *)loadEntryPoint(realdll,"alcGetCurrentContext",0,&okay);
  REAL_alcGetContextsDevice =
       (_func_ALCdevice_ptr_ALCcontext_ptr *)loadEntryPoint(realdll,"alcGetContextsDevice",0,&okay);
  REAL_alcIsExtensionPresent =
       (_func_ALCboolean_ALCdevice_ptr_ALCchar_ptr *)
       loadEntryPoint(realdll,"alcIsExtensionPresent",0,&okay);
  REAL_alcGetProcAddress =
       (_func_void_ptr_ALCdevice_ptr_ALCchar_ptr *)
       loadEntryPoint(realdll,"alcGetProcAddress",0,&okay);
  REAL_alcGetEnumValue =
       (_func_ALCenum_ALCdevice_ptr_ALCchar_ptr *)loadEntryPoint(realdll,"alcGetEnumValue",0,&okay);
  REAL_alcGetString =
       (_func_ALCchar_ptr_ALCdevice_ptr_ALCenum *)loadEntryPoint(realdll,"alcGetString",0,&okay);
  REAL_alcCaptureOpenDevice =
       (_func_ALCdevice_ptr_ALCchar_ptr_ALCuint_ALCenum_ALCsizei *)
       loadEntryPoint(realdll,"alcCaptureOpenDevice",0,&okay);
  REAL_alcCaptureCloseDevice =
       (_func_ALCboolean_ALCdevice_ptr *)loadEntryPoint(realdll,"alcCaptureCloseDevice",0,&okay);
  REAL_alcOpenDevice =
       (_func_ALCdevice_ptr_ALCchar_ptr *)loadEntryPoint(realdll,"alcOpenDevice",0,&okay);
  REAL_alcCloseDevice =
       (_func_ALCboolean_ALCdevice_ptr *)loadEntryPoint(realdll,"alcCloseDevice",0,&okay);
  REAL_alcCreateContext =
       (_func_ALCcontext_ptr_ALCdevice_ptr_ALCint_ptr *)
       loadEntryPoint(realdll,"alcCreateContext",0,&okay);
  REAL_alcMakeContextCurrent =
       (_func_ALCboolean_ALCcontext_ptr *)loadEntryPoint(realdll,"alcMakeContextCurrent",0,&okay);
  REAL_alcProcessContext =
       (_func_void_ALCcontext_ptr *)loadEntryPoint(realdll,"alcProcessContext",0,&okay);
  REAL_alcSuspendContext =
       (_func_void_ALCcontext_ptr *)loadEntryPoint(realdll,"alcSuspendContext",0,&okay);
  REAL_alcDestroyContext =
       (_func_void_ALCcontext_ptr *)loadEntryPoint(realdll,"alcDestroyContext",0,&okay);
  REAL_alcGetError = (_func_ALCenum_ALCdevice_ptr *)loadEntryPoint(realdll,"alcGetError",0,&okay);
  REAL_alcGetIntegerv =
       (_func_void_ALCdevice_ptr_ALCenum_ALCsizei_ALCint_ptr *)
       loadEntryPoint(realdll,"alcGetIntegerv",0,&okay);
  REAL_alcCaptureStart =
       (_func_void_ALCdevice_ptr *)loadEntryPoint(realdll,"alcCaptureStart",0,&okay);
  REAL_alcCaptureStop = (_func_void_ALCdevice_ptr *)loadEntryPoint(realdll,"alcCaptureStop",0,&okay)
  ;
  REAL_alcCaptureSamples =
       (_func_void_ALCdevice_ptr_ALCvoid_ptr_ALCsizei *)
       loadEntryPoint(realdll,"alcCaptureSamples",0,&okay);
  REAL_alDopplerFactor = (_func_void_ALfloat *)loadEntryPoint(realdll,"alDopplerFactor",0,&okay);
  REAL_alDopplerVelocity = (_func_void_ALfloat *)loadEntryPoint(realdll,"alDopplerVelocity",0,&okay)
  ;
  REAL_alSpeedOfSound = (_func_void_ALfloat *)loadEntryPoint(realdll,"alSpeedOfSound",0,&okay);
  REAL_alDistanceModel = (_func_void_ALenum *)loadEntryPoint(realdll,"alDistanceModel",0,&okay);
  REAL_alEnable = (_func_void_ALenum *)loadEntryPoint(realdll,"alEnable",0,&okay);
  REAL_alDisable = (_func_void_ALenum *)loadEntryPoint(realdll,"alDisable",0,&okay);
  REAL_alIsEnabled = (_func_ALboolean_ALenum *)loadEntryPoint(realdll,"alIsEnabled",0,&okay);
  REAL_alGetString = (_func_ALchar_ptr_ALenum *)loadEntryPoint(realdll,"alGetString",0,&okay);
  REAL_alGetBooleanv =
       (_func_void_ALenum_ALboolean_ptr *)loadEntryPoint(realdll,"alGetBooleanv",0,&okay);
  REAL_alGetIntegerv =
       (_func_void_ALenum_ALint_ptr *)loadEntryPoint(realdll,"alGetIntegerv",0,&okay);
  REAL_alGetFloatv = (_func_void_ALenum_ALfloat_ptr *)loadEntryPoint(realdll,"alGetFloatv",0,&okay);
  REAL_alGetDoublev =
       (_func_void_ALenum_ALdouble_ptr *)loadEntryPoint(realdll,"alGetDoublev",0,&okay);
  REAL_alGetBoolean = (_func_ALboolean_ALenum *)loadEntryPoint(realdll,"alGetBoolean",0,&okay);
  REAL_alGetInteger = (_func_ALint_ALenum *)loadEntryPoint(realdll,"alGetInteger",0,&okay);
  REAL_alGetFloat = (_func_ALfloat_ALenum *)loadEntryPoint(realdll,"alGetFloat",0,&okay);
  REAL_alGetDouble = (_func_ALdouble_ALenum *)loadEntryPoint(realdll,"alGetDouble",0,&okay);
  REAL_alIsExtensionPresent =
       (_func_ALboolean_ALchar_ptr *)loadEntryPoint(realdll,"alIsExtensionPresent",0,&okay);
  REAL_alGetError = (_func_ALenum *)loadEntryPoint(realdll,"alGetError",0,&okay);
  REAL_alGetProcAddress =
       (_func_void_ptr_ALchar_ptr *)loadEntryPoint(realdll,"alGetProcAddress",0,&okay);
  REAL_alGetEnumValue = (_func_ALenum_ALchar_ptr *)loadEntryPoint(realdll,"alGetEnumValue",0,&okay);
  REAL_alListenerfv =
       (_func_void_ALenum_ALfloat_ptr *)loadEntryPoint(realdll,"alListenerfv",0,&okay);
  REAL_alListenerf = (_func_void_ALenum_ALfloat *)loadEntryPoint(realdll,"alListenerf",0,&okay);
  REAL_alListener3f =
       (_func_void_ALenum_ALfloat_ALfloat_ALfloat *)loadEntryPoint(realdll,"alListener3f",0,&okay);
  REAL_alListeneriv = (_func_void_ALenum_ALint_ptr *)loadEntryPoint(realdll,"alListeneriv",0,&okay);
  REAL_alListeneri = (_func_void_ALenum_ALint *)loadEntryPoint(realdll,"alListeneri",0,&okay);
  REAL_alListener3i =
       (_func_void_ALenum_ALint_ALint_ALint *)loadEntryPoint(realdll,"alListener3i",0,&okay);
  REAL_alGetListenerfv =
       (_func_void_ALenum_ALfloat_ptr *)loadEntryPoint(realdll,"alGetListenerfv",0,&okay);
  REAL_alGetListenerf =
       (_func_void_ALenum_ALfloat_ptr *)loadEntryPoint(realdll,"alGetListenerf",0,&okay);
  REAL_alGetListener3f =
       (_func_void_ALenum_ALfloat_ptr_ALfloat_ptr_ALfloat_ptr *)
       loadEntryPoint(realdll,"alGetListener3f",0,&okay);
  REAL_alGetListeneri =
       (_func_void_ALenum_ALint_ptr *)loadEntryPoint(realdll,"alGetListeneri",0,&okay);
  REAL_alGetListeneriv =
       (_func_void_ALenum_ALint_ptr *)loadEntryPoint(realdll,"alGetListeneriv",0,&okay);
  REAL_alGetListener3i =
       (_func_void_ALenum_ALint_ptr_ALint_ptr_ALint_ptr *)
       loadEntryPoint(realdll,"alGetListener3i",0,&okay);
  REAL_alGenSources =
       (_func_void_ALsizei_ALuint_ptr *)loadEntryPoint(realdll,"alGenSources",0,&okay);
  REAL_alDeleteSources =
       (_func_void_ALsizei_ALuint_ptr *)loadEntryPoint(realdll,"alDeleteSources",0,&okay);
  REAL_alIsSource = (_func_ALboolean_ALuint *)loadEntryPoint(realdll,"alIsSource",0,&okay);
  REAL_alSourcefv =
       (_func_void_ALuint_ALenum_ALfloat_ptr *)loadEntryPoint(realdll,"alSourcefv",0,&okay);
  REAL_alSourcef = (_func_void_ALuint_ALenum_ALfloat *)loadEntryPoint(realdll,"alSourcef",0,&okay);
  REAL_alSource3f =
       (_func_void_ALuint_ALenum_ALfloat_ALfloat_ALfloat *)
       loadEntryPoint(realdll,"alSource3f",0,&okay);
  REAL_alSourceiv =
       (_func_void_ALuint_ALenum_ALint_ptr *)loadEntryPoint(realdll,"alSourceiv",0,&okay);
  REAL_alSourcei = (_func_void_ALuint_ALenum_ALint *)loadEntryPoint(realdll,"alSourcei",0,&okay);
  REAL_alSource3i =
       (_func_void_ALuint_ALenum_ALint_ALint_ALint *)loadEntryPoint(realdll,"alSource3i",0,&okay);
  REAL_alGetSourcefv =
       (_func_void_ALuint_ALenum_ALfloat_ptr *)loadEntryPoint(realdll,"alGetSourcefv",0,&okay);
  REAL_alGetSourcef =
       (_func_void_ALuint_ALenum_ALfloat_ptr *)loadEntryPoint(realdll,"alGetSourcef",0,&okay);
  REAL_alGetSource3f =
       (_func_void_ALuint_ALenum_ALfloat_ptr_ALfloat_ptr_ALfloat_ptr *)
       loadEntryPoint(realdll,"alGetSource3f",0,&okay);
  REAL_alGetSourceiv =
       (_func_void_ALuint_ALenum_ALint_ptr *)loadEntryPoint(realdll,"alGetSourceiv",0,&okay);
  REAL_alGetSourcei =
       (_func_void_ALuint_ALenum_ALint_ptr *)loadEntryPoint(realdll,"alGetSourcei",0,&okay);
  REAL_alGetSource3i =
       (_func_void_ALuint_ALenum_ALint_ptr_ALint_ptr_ALint_ptr *)
       loadEntryPoint(realdll,"alGetSource3i",0,&okay);
  REAL_alSourcePlay = (_func_void_ALuint *)loadEntryPoint(realdll,"alSourcePlay",0,&okay);
  REAL_alSourcePlayv =
       (_func_void_ALsizei_ALuint_ptr *)loadEntryPoint(realdll,"alSourcePlayv",0,&okay);
  REAL_alSourcePause = (_func_void_ALuint *)loadEntryPoint(realdll,"alSourcePause",0,&okay);
  REAL_alSourcePausev =
       (_func_void_ALsizei_ALuint_ptr *)loadEntryPoint(realdll,"alSourcePausev",0,&okay);
  REAL_alSourceRewind = (_func_void_ALuint *)loadEntryPoint(realdll,"alSourceRewind",0,&okay);
  REAL_alSourceRewindv =
       (_func_void_ALsizei_ALuint_ptr *)loadEntryPoint(realdll,"alSourceRewindv",0,&okay);
  REAL_alSourceStop = (_func_void_ALuint *)loadEntryPoint(realdll,"alSourceStop",0,&okay);
  REAL_alSourceStopv =
       (_func_void_ALsizei_ALuint_ptr *)loadEntryPoint(realdll,"alSourceStopv",0,&okay);
  REAL_alSourceQueueBuffers =
       (_func_void_ALuint_ALsizei_ALuint_ptr *)
       loadEntryPoint(realdll,"alSourceQueueBuffers",0,&okay);
  REAL_alSourceUnqueueBuffers =
       (_func_void_ALuint_ALsizei_ALuint_ptr *)
       loadEntryPoint(realdll,"alSourceUnqueueBuffers",0,&okay);
  REAL_alGenBuffers =
       (_func_void_ALsizei_ALuint_ptr *)loadEntryPoint(realdll,"alGenBuffers",0,&okay);
  REAL_alDeleteBuffers =
       (_func_void_ALsizei_ALuint_ptr *)loadEntryPoint(realdll,"alDeleteBuffers",0,&okay);
  REAL_alIsBuffer = (_func_ALboolean_ALuint *)loadEntryPoint(realdll,"alIsBuffer",0,&okay);
  REAL_alBufferData =
       (_func_void_ALuint_ALenum_ALvoid_ptr_ALsizei_ALsizei *)
       loadEntryPoint(realdll,"alBufferData",0,&okay);
  REAL_alBufferfv =
       (_func_void_ALuint_ALenum_ALfloat_ptr *)loadEntryPoint(realdll,"alBufferfv",0,&okay);
  REAL_alBufferf = (_func_void_ALuint_ALenum_ALfloat *)loadEntryPoint(realdll,"alBufferf",0,&okay);
  REAL_alBuffer3f =
       (_func_void_ALuint_ALenum_ALfloat_ALfloat_ALfloat *)
       loadEntryPoint(realdll,"alBuffer3f",0,&okay);
  REAL_alBufferiv =
       (_func_void_ALuint_ALenum_ALint_ptr *)loadEntryPoint(realdll,"alBufferiv",0,&okay);
  REAL_alBufferi = (_func_void_ALuint_ALenum_ALint *)loadEntryPoint(realdll,"alBufferi",0,&okay);
  REAL_alBuffer3i =
       (_func_void_ALuint_ALenum_ALint_ALint_ALint *)loadEntryPoint(realdll,"alBuffer3i",0,&okay);
  REAL_alGetBufferfv =
       (_func_void_ALuint_ALenum_ALfloat_ptr *)loadEntryPoint(realdll,"alGetBufferfv",0,&okay);
  REAL_alGetBufferf =
       (_func_void_ALuint_ALenum_ALfloat_ptr *)loadEntryPoint(realdll,"alGetBufferf",0,&okay);
  REAL_alGetBuffer3f =
       (_func_void_ALuint_ALenum_ALfloat_ptr_ALfloat_ptr_ALfloat_ptr *)
       loadEntryPoint(realdll,"alGetBuffer3f",0,&okay);
  REAL_alGetBufferi =
       (_func_void_ALuint_ALenum_ALint_ptr *)loadEntryPoint(realdll,"alGetBufferi",0,&okay);
  REAL_alGetBuffer3i =
       (_func_void_ALuint_ALenum_ALint_ptr_ALint_ptr_ALint_ptr *)
       loadEntryPoint(realdll,"alGetBuffer3i",0,&okay);
  REAL_alGetBufferiv =
       (_func_void_ALuint_ALenum_ALint_ptr *)loadEntryPoint(realdll,"alGetBufferiv",0,&okay);
  REAL_alTracePushScope = (_func_void_ALchar_ptr *)dlsym(realdll,"alTracePushScope");
  REAL_alTracePopScope = (_func_void *)dlsym(realdll,"alTracePopScope");
  REAL_alTraceMessage = (_func_void_ALchar_ptr *)dlsym(realdll,"alTraceMessage");
  REAL_alTraceBufferLabel = (_func_void_ALuint_ALchar_ptr *)dlsym(realdll,"alTraceBufferLabel");
  REAL_alTraceSourceLabel = (_func_void_ALuint_ALchar_ptr *)dlsym(realdll,"alTraceSourceLabel");
  REAL_alcTraceDeviceLabel =
       (_func_void_ALCdevice_ptr_ALchar_ptr *)dlsym(realdll,"alcTraceDeviceLabel");
  REAL_alcTraceContextLabel =
       (_func_void_ALCcontext_ptr_ALchar_ptr *)dlsym(realdll,"alcTraceContextLabel");
  return okay;
}

Assistant:

int load_real_openal(void)
{
    int extensions = 0;
    int okay = 1;
    #ifdef __APPLE__
    const char *dllname = "libopenal.1.dylib";
    #elif defined(_WIN32)
    const char *dllname = "openal32.dll";
    #else
    const char *dllname = "libopenal.so.1";
    #endif

    realdll = dlopen(dllname, RTLD_NOW | RTLD_LOCAL);
    if (!realdll) {
        fprintf(stderr, "%s: Failed to load %s: %s\n", GAppName, dllname, dlerror());
        fflush(stderr);
    }

    if (!realdll) {
        // Not in the libpath? See if we can find it in the cwd.
        char *cwd = getcwd(NULL, 0);
        if (cwd) {
            const size_t fulllen = strlen(cwd) + strlen(dllname) + 2;
            char *fullpath = (char *) malloc(fulllen);
            if (fullpath) {
                snprintf(fullpath, fulllen, "%s/%s", cwd, dllname);
                realdll = dlopen(dllname, RTLD_NOW | RTLD_LOCAL);
                if (!realdll) {
                    fprintf(stderr, "%s: Failed to load %s: %s\n", GAppName, fullpath, dlerror());
                    fflush(stderr);
                }
                free(fullpath);
            }
            free(cwd);
        }
    }

    if (!realdll) {
        fprintf(stderr, "%s: Couldn't load OpenAL from anywhere obvious. Giving up.\n", GAppName);
        fflush(stderr);
        return 0;
    }

    #define ENTRYPOINT_EXTENSIONS_BEGIN() extensions = 1;
    #define ENTRYPOINT(ret,name,params,args,numargs,visitparams,visitargs) REAL_##name = (ret (*)params) loadEntryPoint(realdll, #name, extensions, &okay);
    #include "altrace_entrypoints.h"
    return okay;
}